

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapKey::~MapKey(MapKey *this)

{
  string *this_00;
  undefined8 *in_RDI;
  
  if ((*(int *)(in_RDI + 1) == 9) && (this_00 = (string *)*in_RDI, this_00 != (string *)0x0)) {
    std::__cxx11::string::~string(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

~MapKey() {
    if (type_ == FieldDescriptor::CPPTYPE_STRING) {
      delete val_.string_value_;
    }
  }